

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser-test.cc
# Opt level: O2

void __thiscall ParserTest_UnindentBlock_Test::TestBody(ParserTest_UnindentBlock_Test *this)

{
  char *in_RDX;
  char *message;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  string local_28;
  
  (anonymous_namespace)::Parse_abi_cxx11_(&local_28,(_anonymous_namespace_ *)" abc\ndef",in_RDX);
  testing::internal::CmpHelperEQ<char[39],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"<blockquote>abc</blockquote><p>def</p>\"",
             "Parse(\" abc\\ndef\")",(char (*) [39])"<blockquote>abc</blockquote><p>def</p>",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/rstparser-test.cc",
               0x83,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(ParserTest, UnindentBlock) {
  EXPECT_EQ("<blockquote>abc</blockquote><p>def</p>", Parse(" abc\ndef"));
}